

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O1

int lua_gc(lua_State *L,int what,int data)

{
  global_State *g;
  uint uVar1;
  l_mem debt;
  
  if (0xb < (uint)what) {
    return -1;
  }
  g = L->l_G;
  switch(what) {
  case 0:
    g->gcrunning = '\0';
    goto LAB_0010a38c;
  case 1:
    uVar1 = 0;
    luaE_setdebt(g,0);
    g->gcrunning = '\x01';
    break;
  case 2:
    uVar1 = 0;
    luaC_fullgc(L,0);
    break;
  case 3:
    uVar1 = (uint)(g->GCdebt + g->totalbytes >> 10);
    break;
  case 4:
    uVar1 = (int)g->GCdebt + (int)g->totalbytes & 0x3ff;
    break;
  case 5:
    if (g->gckind == '\x02') {
      uVar1 = (uint)(g->GCestimate == 0);
      luaC_forcestep(L);
    }
    else {
      debt = (long)data * 0x400 + -0x960;
      if (g->gcrunning != '\0') {
        debt = debt + g->GCdebt;
      }
      luaE_setdebt(g,debt);
      luaC_forcestep(L);
      uVar1 = (uint)(g->gcstate == '\x05');
    }
    break;
  case 6:
    uVar1 = g->gcpause;
    g->gcpause = data;
    break;
  case 7:
    uVar1 = g->gcstepmul;
    g->gcstepmul = data;
    break;
  case 8:
    uVar1 = g->gcmajorinc;
    g->gcmajorinc = data;
    break;
  case 9:
    uVar1 = (uint)g->gcrunning;
    break;
  case 10:
    luaC_changemode(L,2);
LAB_0010a38c:
    uVar1 = 0;
    break;
  case 0xb:
    uVar1 = 0;
    luaC_changemode(L,0);
  }
  return uVar1;
}

Assistant:

LUA_API int lua_gc (lua_State *L, int what, int data) {
  int res = 0;
  global_State *g;
  lua_lock(L);
  g = G(L);
  switch (what) {
    case LUA_GCSTOP: {
      g->gcrunning = 0;
      break;
    }
    case LUA_GCRESTART: {
      luaE_setdebt(g, 0);
      g->gcrunning = 1;
      break;
    }
    case LUA_GCCOLLECT: {
      luaC_fullgc(L, 0);
      break;
    }
    case LUA_GCCOUNT: {
      /* GC values are expressed in Kbytes: #bytes/2^10 */
      res = cast_int(gettotalbytes(g) >> 10);
      break;
    }
    case LUA_GCCOUNTB: {
      res = cast_int(gettotalbytes(g) & 0x3ff);
      break;
    }
    case LUA_GCSTEP: {
      if (g->gckind == KGC_GEN) {  /* generational mode? */
        res = (g->GCestimate == 0);  /* true if it will do major collection */
        luaC_forcestep(L);  /* do a single step */
      }
      else {
       lu_mem debt = cast(lu_mem, data) * 1024 - GCSTEPSIZE;
       if (g->gcrunning)
         debt += g->GCdebt;  /* include current debt */
       luaE_setdebt(g, debt);
       luaC_forcestep(L);
       if (g->gcstate == GCSpause)  /* end of cycle? */
         res = 1;  /* signal it */
      }
      break;
    }
    case LUA_GCSETPAUSE: {
      res = g->gcpause;
      g->gcpause = data;
      break;
    }
    case LUA_GCSETMAJORINC: {
      res = g->gcmajorinc;
      g->gcmajorinc = data;
      break;
    }
    case LUA_GCSETSTEPMUL: {
      res = g->gcstepmul;
      g->gcstepmul = data;
      break;
    }
    case LUA_GCISRUNNING: {
      res = g->gcrunning;
      break;
    }
    case LUA_GCGEN: {  /* change collector to generational mode */
      luaC_changemode(L, KGC_GEN);
      break;
    }
    case LUA_GCINC: {  /* change collector to incremental mode */
      luaC_changemode(L, KGC_NORMAL);
      break;
    }
    default: res = -1;  /* invalid option */
  }
  lua_unlock(L);
  return res;
}